

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O3

uint32_t skynet_handle_register(skynet_context *ctx)

{
  handle_storage *phVar1;
  uint uVar2;
  uint32_t uVar3;
  skynet_context **ppsVar4;
  ulong uVar5;
  int iVar6;
  skynet_context **__ptr;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  phVar1 = H;
  do {
    LOCK();
    iVar8 = (phVar1->lock).write;
    (phVar1->lock).write = 1;
    UNLOCK();
  } while (iVar8 != 0);
  do {
  } while ((phVar1->lock).read != 0);
  iVar8 = phVar1->slot_size;
  do {
    if (0 < iVar8) {
      iVar6 = 0;
      do {
        uVar2 = phVar1->handle_index + iVar6 & 0xffffff;
        uVar7 = uVar2 & iVar8 - 1U;
        if (phVar1->slot[uVar7] == (skynet_context *)0x0) {
          phVar1->slot[uVar7] = ctx;
          phVar1->handle_index = uVar2 + 1;
          (phVar1->lock).write = 0;
          return uVar2 | phVar1->harbor;
        }
        iVar6 = iVar6 + 1;
      } while (iVar8 != iVar6);
      if (0x800000 < iVar8) {
        __assert_fail("(s->slot_size*2 - 1) <= HANDLE_MASK",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                      ,0x37,"uint32_t skynet_handle_register(struct skynet_context *)");
      }
    }
    ppsVar4 = (skynet_context **)calloc(1,(long)(iVar8 * 2) << 3);
    __ptr = phVar1->slot;
    if (0 < iVar8) {
      lVar9 = 0;
      do {
        uVar3 = skynet_context_handle(__ptr[lVar9]);
        iVar8 = phVar1->slot_size;
        uVar5 = (long)(int)uVar3 & (long)iVar8 * 2 - 1U;
        if (ppsVar4[uVar5] != (skynet_context *)0x0) {
          __assert_fail("new_slot[hash] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                        ,0x3c,"uint32_t skynet_handle_register(struct skynet_context *)");
        }
        __ptr = phVar1->slot;
        ppsVar4[uVar5] = __ptr[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar8);
    }
    free(__ptr);
    phVar1->slot = ppsVar4;
    iVar8 = phVar1->slot_size * 2;
    phVar1->slot_size = iVar8;
  } while( true );
}

Assistant:

uint32_t
skynet_handle_register(struct skynet_context *ctx) {
	struct handle_storage *s = H;

	rwlock_wlock(&s->lock);
	
	for (;;) {
		int i;
		for (i=0;i<s->slot_size;i++) {
			uint32_t handle = (i+s->handle_index) & HANDLE_MASK;
			int hash = handle & (s->slot_size-1);
			if (s->slot[hash] == NULL) {
				s->slot[hash] = ctx;
				s->handle_index = handle + 1;

				rwlock_wunlock(&s->lock);

				handle |= s->harbor;
				return handle;
			}
		}
		assert((s->slot_size*2 - 1) <= HANDLE_MASK);
		struct skynet_context ** new_slot = skynet_malloc(s->slot_size * 2 * sizeof(struct skynet_context *));
		memset(new_slot, 0, s->slot_size * 2 * sizeof(struct skynet_context *));
		for (i=0;i<s->slot_size;i++) {
			int hash = skynet_context_handle(s->slot[i]) & (s->slot_size * 2 - 1);
			assert(new_slot[hash] == NULL);
			new_slot[hash] = s->slot[i];
		}
		skynet_free(s->slot);
		s->slot = new_slot;
		s->slot_size *= 2;
	}
}